

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O1

bool __thiscall
brotli::HashLongestMatch<14,_4,_4>::FindLongestMatch
          (HashLongestMatch<14,_4,_4> *this,uint8_t *data,size_t ring_buffer_mask,
          int *distance_cache,size_t cur_ix,size_t max_length,size_t max_backward,
          size_t *best_len_out,size_t *best_len_code_out,size_t *best_distance_out,
          double *best_score_out)

{
  uint8_t *puVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  ulong uVar6;
  uint8_t *puVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  size_t sVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  size_t i_1;
  ulong uVar19;
  int iVar20;
  size_t i;
  ulong uVar21;
  size_t sVar22;
  long lVar23;
  uint8_t *puVar24;
  bool bVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  *best_len_code_out = 0;
  uVar9 = cur_ix & ring_buffer_mask;
  dVar26 = *best_score_out;
  uVar8 = *best_len_out;
  bVar5 = false;
  *best_len_out = 0;
  uVar18 = (ulong)((uint)max_length & 7);
  puVar1 = data + uVar9;
  uVar21 = 0;
  do {
    uVar6 = (long)(int)(&kDistanceCacheOffset)[uVar21] +
            (long)distance_cache[(uint)(&kDistanceCacheIndex)[uVar21]];
    if ((uVar6 <= max_backward && cur_ix - uVar6 < cur_ix) && (uVar8 + uVar9 <= ring_buffer_mask)) {
      uVar13 = cur_ix - uVar6 & ring_buffer_mask;
      if ((uVar13 + uVar8 <= ring_buffer_mask) && (data[uVar8 + uVar9] == data[uVar13 + uVar8])) {
        if (7 < max_length) {
          lVar23 = 0;
          uVar16 = 0;
LAB_0016e9ab:
          if (*(ulong *)(puVar1 + uVar16 * 8) == *(ulong *)(data + uVar16 * 8 + uVar13))
          goto code_r0x0016e9bd;
          uVar16 = *(ulong *)(data + uVar16 * 8 + uVar13) ^ *(ulong *)(puVar1 + uVar16 * 8);
          uVar13 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
            }
          }
          uVar16 = (uVar13 >> 3 & 0x1fffffff) - lVar23;
          goto LAB_0016e9f2;
        }
        uVar17 = 0;
        puVar24 = puVar1;
LAB_0016ea7f:
        uVar16 = uVar17;
        if (uVar18 != 0) {
          uVar11 = uVar17 | uVar18;
          uVar19 = uVar18;
          do {
            uVar16 = uVar17;
            if (data[uVar17 + uVar13] != *puVar24) break;
            puVar24 = puVar24 + 1;
            uVar17 = uVar17 + 1;
            uVar19 = uVar19 - 1;
            uVar16 = uVar11;
          } while (uVar19 != 0);
        }
LAB_0016e9f2:
        if (((2 < uVar16) || ((uVar21 < 2 && (uVar16 == 2)))) &&
           (auVar28._8_4_ = (int)(uVar16 >> 0x20), auVar28._0_8_ = uVar16,
           auVar28._12_4_ = 0x45300000,
           dVar27 = ((auVar28._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar16) - 4503599627370496.0)) * 5.4 -
                    (double)(&BackwardReferenceScoreUsingLastDistance(unsigned_long,unsigned_long)::
                              kDistanceShortCodeBitCost)[uVar21], dVar26 < dVar27)) {
          *best_len_out = uVar16;
          *best_len_code_out = uVar16;
          *best_distance_out = uVar6;
          *best_score_out = dVar27;
          bVar5 = true;
          uVar8 = uVar16;
          dVar26 = dVar27;
        }
      }
    }
    uVar21 = uVar21 + 1;
  } while (uVar21 != 4);
  puVar1 = data + uVar9;
  uVar15 = (uint)(*(int *)(data + uVar9) * 0x1e35a7bd) >> 0x12;
  uVar2 = this->num_[uVar15];
  uVar21 = (ulong)uVar2;
  uVar18 = 0;
  if (0x10 < uVar2) {
    uVar18 = (ulong)(uVar2 - 0x10);
  }
  if (uVar18 < uVar21) {
    uVar6 = (ulong)((uint)max_length & 7);
    do {
      uVar21 = uVar21 - 1;
      uVar3 = *(uint *)((long)this->buckets_[0] +
                       (ulong)((uint)uVar21 & 0xf) * 4 + (ulong)(uVar15 << 6));
      iVar20 = 5;
      uVar13 = cur_ix - uVar3;
      if ((uVar13 != 0) && (uVar13 <= max_backward)) {
        iVar20 = 6;
        if (uVar8 + uVar9 <= ring_buffer_mask) {
          uVar16 = (ulong)(uVar3 & (uint)ring_buffer_mask);
          if ((uVar16 + uVar8 <= ring_buffer_mask) && (data[uVar8 + uVar9] == data[uVar16 + uVar8]))
          {
            if (7 < max_length) {
              lVar23 = 0;
              uVar17 = 0;
LAB_0016eba8:
              if (*(ulong *)(puVar1 + uVar17 * 8) == *(ulong *)(data + uVar17 * 8 + uVar16))
              goto code_r0x0016ebba;
              uVar17 = *(ulong *)(data + uVar17 * 8 + uVar16) ^ *(ulong *)(puVar1 + uVar17 * 8);
              uVar16 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                }
              }
              uVar17 = (uVar16 >> 3 & 0x1fffffff) - lVar23;
              goto LAB_0016ebe5;
            }
            puVar24 = puVar1;
            uVar19 = 0;
LAB_0016ec75:
            uVar17 = uVar19;
            if (uVar6 != 0) {
              uVar12 = uVar19 | uVar6;
              uVar11 = uVar6;
              do {
                uVar17 = uVar19;
                if (data[uVar19 + uVar16] != *puVar24) break;
                puVar24 = puVar24 + 1;
                uVar19 = uVar19 + 1;
                uVar11 = uVar11 - 1;
                uVar17 = uVar12;
              } while (uVar11 != 0);
            }
LAB_0016ebe5:
            iVar20 = 0;
            if (3 < uVar17) {
              auVar29._8_4_ = (int)(uVar17 >> 0x20);
              auVar29._0_8_ = uVar17;
              auVar29._12_4_ = 0x45300000;
              iVar4 = 0x1f;
              if ((uint)uVar13 != 0) {
                for (; (uint)uVar13 >> iVar4 == 0; iVar4 = iVar4 + -1) {
                }
              }
              dVar27 = ((auVar29._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar17) - 4503599627370496.0)) * 5.4 +
                       (double)iVar4 * -1.2;
              if (dVar26 < dVar27) {
                *best_len_out = uVar17;
                *best_len_code_out = uVar17;
                *best_distance_out = uVar13;
                *best_score_out = dVar27;
                bVar5 = true;
                uVar8 = uVar17;
                dVar26 = dVar27;
              }
            }
          }
        }
      }
    } while (((iVar20 == 6) || (iVar20 == 0)) && (uVar18 < uVar21));
  }
  *(int *)((long)this->buckets_[0] + (ulong)(uVar2 & 0xf) * 4 + (ulong)(uVar15 << 6)) = (int)cur_ix;
  this->num_[uVar15] = uVar2 + 1;
  if ((!bVar5) && (this->num_dict_lookups_ >> 7 <= this->num_dict_matches_)) {
    uVar8 = (ulong)(uVar15 * 2);
    sVar10 = this->num_dict_lookups_;
    sVar14 = this->num_dict_matches_;
    iVar20 = 0;
    do {
      sVar10 = sVar10 + 1;
      this->num_dict_lookups_ = sVar10;
      uVar2 = *(ushort *)(kStaticDictionaryHash + uVar8 * 2);
      if (uVar2 != 0) {
        uVar15 = uVar2 & 0x1f;
        uVar9 = (ulong)uVar15;
        if (uVar9 <= max_length) {
          puVar24 = kBrotliDictionary +
                    uVar9 * (uVar2 >> 5) + (ulong)kBrotliDictionaryOffsetsByLength[uVar9];
          if (7 < uVar15) {
            uVar21 = (ulong)(uVar2 & 0x18);
            puVar7 = puVar24 + uVar21;
            uVar18 = 0;
LAB_0016ed9c:
            if (*(ulong *)(puVar24 + uVar18) == *(ulong *)(puVar1 + uVar18)) goto code_r0x0016edae;
            uVar6 = *(ulong *)(puVar1 + uVar18) ^ *(ulong *)(puVar24 + uVar18);
            uVar21 = 0;
            if (uVar6 != 0) {
              for (; (uVar6 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
              }
            }
            uVar18 = (uVar21 >> 3 & 0x1fffffff) + uVar18;
            goto LAB_0016edd7;
          }
          uVar21 = 0;
          puVar7 = puVar24;
LAB_0016ee93:
          uVar6 = uVar9 & 7;
          uVar18 = uVar21;
          if ((uVar2 & 7) != 0) {
            uVar13 = uVar21 | uVar6;
            do {
              uVar18 = uVar21;
              if (puVar1[uVar21] != *puVar7) break;
              puVar7 = puVar7 + 1;
              uVar21 = uVar21 + 1;
              uVar6 = uVar6 - 1;
              uVar18 = uVar13;
            } while (uVar6 != 0);
          }
LAB_0016edd7:
          if ((uVar18 != 0) && (uVar9 < uVar18 + 10)) {
            sVar22 = (ulong)(uVar2 >> 5) + max_backward + 1 +
                     (long)(1 << (""[uVar9] & 0x1f)) *
                     (ulong)(byte)kCutoffTransforms[uVar9 - uVar18];
            auVar30._8_4_ = (int)(uVar18 >> 0x20);
            auVar30._0_8_ = uVar18;
            auVar30._12_4_ = 0x45300000;
            iVar4 = 0x1f;
            uVar15 = (uint)sVar22;
            if (uVar15 != 0) {
              for (; uVar15 >> iVar4 == 0; iVar4 = iVar4 + -1) {
              }
            }
            dVar27 = ((auVar30._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar18) - 4503599627370496.0)) * 5.4 +
                     (double)iVar4 * -1.2;
            if (dVar26 < dVar27) {
              sVar14 = sVar14 + 1;
              this->num_dict_matches_ = sVar14;
              *best_len_out = uVar18;
              *best_len_code_out = uVar9;
              *best_distance_out = sVar22;
              *best_score_out = dVar27;
              bVar5 = true;
              dVar26 = dVar27;
            }
          }
        }
      }
      uVar8 = uVar8 + 1;
      bVar25 = iVar20 == 0;
      iVar20 = iVar20 + 1;
    } while (bVar25);
  }
  return bVar5;
code_r0x0016e9bd:
  uVar16 = uVar16 + 1;
  lVar23 = lVar23 + -8;
  uVar17 = max_length & 0xfffffffffffffff8;
  puVar24 = puVar1 + (max_length & 0xfffffffffffffff8);
  if (max_length >> 3 == uVar16) goto LAB_0016ea7f;
  goto LAB_0016e9ab;
code_r0x0016ebba:
  uVar17 = uVar17 + 1;
  lVar23 = lVar23 + -8;
  puVar24 = puVar1 + (max_length & 0xfffffffffffffff8);
  uVar19 = max_length & 0xfffffffffffffff8;
  if (max_length >> 3 == uVar17) goto LAB_0016ec75;
  goto LAB_0016eba8;
code_r0x0016edae:
  uVar18 = uVar18 + 8;
  if (uVar21 == uVar18) goto LAB_0016ee93;
  goto LAB_0016ed9c;
}

Assistant:

bool FindLongestMatch(const uint8_t * __restrict data,
                        const size_t ring_buffer_mask,
                        const int* __restrict distance_cache,
                        const size_t cur_ix,
                        const size_t max_length,
                        const size_t max_backward,
                        size_t * __restrict best_len_out,
                        size_t * __restrict best_len_code_out,
                        size_t * __restrict best_distance_out,
                        double * __restrict best_score_out) {
    *best_len_code_out = 0;
    const size_t cur_ix_masked = cur_ix & ring_buffer_mask;
    bool match_found = false;
    // Don't accept a short copy from far away.
    double best_score = *best_score_out;
    size_t best_len = *best_len_out;
    *best_len_out = 0;
    // Try last distance first.
    for (size_t i = 0; i < kNumLastDistancesToCheck; ++i) {
      const size_t idx = kDistanceCacheIndex[i];
      const size_t backward =
          static_cast<size_t>(distance_cache[idx] + kDistanceCacheOffset[i]);
      size_t prev_ix = static_cast<size_t>(cur_ix - backward);
      if (prev_ix >= cur_ix) {
        continue;
      }
      if (PREDICT_FALSE(backward > max_backward)) {
        continue;
      }
      prev_ix &= ring_buffer_mask;

      if (cur_ix_masked + best_len > ring_buffer_mask ||
          prev_ix + best_len > ring_buffer_mask ||
          data[cur_ix_masked + best_len] != data[prev_ix + best_len]) {
        continue;
      }
      const size_t len = FindMatchLengthWithLimit(&data[prev_ix],
                                                  &data[cur_ix_masked],
                                                  max_length);
      if (len >= 3 || (len == 2 && i < 2)) {
        // Comparing for >= 2 does not change the semantics, but just saves for
        // a few unnecessary binary logarithms in backward reference score,
        // since we are not interested in such short matches.
        double score = BackwardReferenceScoreUsingLastDistance(len, i);
        if (best_score < score) {
          best_score = score;
          best_len = len;
          *best_len_out = best_len;
          *best_len_code_out = best_len;
          *best_distance_out = backward;
          *best_score_out = best_score;
          match_found = true;
        }
      }
    }
    const uint32_t key = HashBytes(&data[cur_ix_masked]);
    const uint32_t * __restrict const bucket = &buckets_[key][0];
    const size_t down = (num_[key] > kBlockSize) ? (num_[key] - kBlockSize) : 0;
    for (size_t i = num_[key]; i > down;) {
      --i;
      size_t prev_ix = bucket[i & kBlockMask];
      const size_t backward = cur_ix - prev_ix;
      if (PREDICT_FALSE(backward == 0 || backward > max_backward)) {
        break;
      }
      prev_ix &= ring_buffer_mask;
      if (cur_ix_masked + best_len > ring_buffer_mask ||
          prev_ix + best_len > ring_buffer_mask ||
          data[cur_ix_masked + best_len] != data[prev_ix + best_len]) {
        continue;
      }
      const size_t len = FindMatchLengthWithLimit(&data[prev_ix],
                                                  &data[cur_ix_masked],
                                                  max_length);
      if (len >= 4) {
        // Comparing for >= 3 does not change the semantics, but just saves
        // for a few unnecessary binary logarithms in backward reference
        // score, since we are not interested in such short matches.
        double score = BackwardReferenceScore(len, backward);
        if (best_score < score) {
          best_score = score;
          best_len = len;
          *best_len_out = best_len;
          *best_len_code_out = best_len;
          *best_distance_out = backward;
          *best_score_out = best_score;
          match_found = true;
        }
      }
    }
    buckets_[key][num_[key] & kBlockMask] = static_cast<uint32_t>(cur_ix);
    ++num_[key];
    if (!match_found && num_dict_matches_ >= (num_dict_lookups_ >> 7)) {
      size_t dict_key = Hash<14>(&data[cur_ix_masked]) << 1;
      for (int k = 0; k < 2; ++k, ++dict_key) {
        ++num_dict_lookups_;
        const uint16_t v = kStaticDictionaryHash[dict_key];
        if (v > 0) {
          const size_t len = v & 31;
          const size_t dist = v >> 5;
          const size_t offset =
              kBrotliDictionaryOffsetsByLength[len] + len * dist;
          if (len <= max_length) {
            const size_t matchlen =
                FindMatchLengthWithLimit(&data[cur_ix_masked],
                                         &kBrotliDictionary[offset], len);
            if (matchlen + kCutoffTransformsCount > len && matchlen > 0) {
              const size_t transform_id = kCutoffTransforms[len - matchlen];
              const size_t word_id =
                  transform_id * (1 << kBrotliDictionarySizeBitsByLength[len]) +
                  dist;
              const size_t backward = max_backward + word_id + 1;
              double score = BackwardReferenceScore(matchlen, backward);
              if (best_score < score) {
                ++num_dict_matches_;
                best_score = score;
                best_len = matchlen;
                *best_len_out = best_len;
                *best_len_code_out = len;
                *best_distance_out = backward;
                *best_score_out = best_score;
                match_found = true;
              }
            }
          }
        }
      }
    }
    return match_found;
  }